

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O0

void __thiscall
kj::_::GzipOutputContext::GzipOutputContext(GzipOutputContext *this,Maybe<int> *compressionLevel)

{
  int *piVar1;
  int *level;
  int *_level35;
  int initResult;
  Maybe<int> *compressionLevel_local;
  GzipOutputContext *this_local;
  
  (this->ctx).next_in = (Bytef *)0x0;
  (this->ctx).avail_in = 0;
  (this->ctx).total_in = 0;
  (this->ctx).next_out = (Bytef *)0x0;
  (this->ctx).avail_out = 0;
  (this->ctx).total_out = 0;
  (this->ctx).msg = (char *)0x0;
  (this->ctx).state = (internal_state *)0x0;
  (this->ctx).zalloc = (alloc_func)0x0;
  (this->ctx).zfree = (free_func)0x0;
  (this->ctx).opaque = (voidpf)0x0;
  (this->ctx).data_type = 0;
  (this->ctx).adler = 0;
  (this->ctx).reserved = 0;
  piVar1 = readMaybe<int>(compressionLevel);
  if (piVar1 == (int *)0x0) {
    this->compressing = false;
    _level35._4_4_ = inflateInit2_(&this->ctx,0x1f,"1.2.11",0x70);
  }
  else {
    this->compressing = true;
    _level35._4_4_ = deflateInit2_(&this->ctx,*piVar1,8,0x1f,8,0,"1.2.11",0x70);
  }
  if (_level35._4_4_ != 0) {
    fail(this,_level35._4_4_);
  }
  return;
}

Assistant:

GzipOutputContext::GzipOutputContext(kj::Maybe<int> compressionLevel) {
  int initResult;

  KJ_IF_SOME(level, compressionLevel) {
    compressing = true;
    initResult =
      deflateInit2(&ctx, level, Z_DEFLATED,
                   15 + 16,  // windowBits = 15 (maximum) + magic value 16 to ask for gzip.
                   8,        // memLevel = 8 (the default)
                   Z_DEFAULT_STRATEGY);
  } else {
    compressing = false;
    initResult = inflateInit2(&ctx, 15 + 16);
  }